

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_switch.cpp
# Opt level: O2

bool __thiscall DActiveButton::AdvanceFrame(DActiveButton *this)

{
  ushort uVar1;
  FSwitchDef *pFVar2;
  int iVar3;
  FSwitchDef **ppFVar4;
  
  ppFVar4 = &this->m_SwitchDef->PairDef;
  if (this->bReturning == false) {
    ppFVar4 = &this->m_SwitchDef;
  }
  pFVar2 = *ppFVar4;
  iVar3 = this->m_Frame;
  this->m_Frame = iVar3 + 1;
  if (iVar3 == pFVar2->NumFrames - 2) {
    if (this->bFlippable != true) {
      return true;
    }
    this->m_Timer = 0x23;
  }
  else {
    this->m_Timer = (uint)pFVar2[1].frames[(long)iVar3 + -3].TimeMin;
    uVar1 = pFVar2[1].frames[(long)iVar3 + -3].TimeRnd;
    if (uVar1 != 0) {
      iVar3 = FRandom::operator()(&pr_switchanim,(uint)uVar1);
      this->m_Timer = this->m_Timer + iVar3;
    }
  }
  return false;
}

Assistant:

bool DActiveButton::AdvanceFrame ()
{
	bool ret = false;
	FSwitchDef *def = bReturning? m_SwitchDef->PairDef : m_SwitchDef;

	if (++m_Frame == def->NumFrames - 1)
	{
		if (bFlippable == true)
		{
			m_Timer = BUTTONTIME;
		}
		else
		{
			ret = true;
		}
	}
	else
	{
		m_Timer = def->frames[m_Frame].TimeMin;
		if (def->frames[m_Frame].TimeRnd != 0)
		{
			m_Timer += pr_switchanim(def->frames[m_Frame].TimeRnd);
		}
	}
	return ret;
}